

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeOctahedronTransform::GeneratePortableAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points,PointAttribute *target_attribute)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  pointer pIVar5;
  ulong uVar6;
  ulong uVar7;
  int32_t t;
  int32_t s;
  float att_val [3];
  int32_t local_5c;
  int32_t local_58;
  uint local_54;
  OctahedronToolBox local_50;
  float local_3c [3];
  
  local_50.quantization_bits_ = this->quantization_bits_;
  local_54 = local_50.quantization_bits_ - 2;
  if (local_54 < 0x1d) {
    lVar1 = (target_attribute->super_GeometryAttribute).byte_offset_;
    lVar2 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_50.max_quantized_value_ = -1 << ((byte)local_50.quantization_bits_ & 0x1f);
    local_50.max_value_ = -local_50.max_quantized_value_ - 2;
    local_50.max_quantized_value_ = ~local_50.max_quantized_value_;
    local_50.dequantization_scale_ = 2.0 / (float)local_50.max_value_;
    local_50.center_value_ = (uint)local_50.max_value_ >> 1;
    pIVar5 = (point_ids->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pIVar5 == (point_ids->
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (num_points != 0) {
        lVar1 = lVar1 + lVar2;
        uVar6 = 0;
        do {
          if (attribute->identity_mapping_ == true) {
            uVar4 = (uint)uVar6;
          }
          else {
            uVar4 = (attribute->indices_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
          }
          sVar3 = (attribute->super_GeometryAttribute).byte_stride_;
          memcpy(local_3c,(void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                   (attribute->super_GeometryAttribute).byte_offset_ + uVar4 * sVar3
                                  ),sVar3);
          OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                    (&local_50,local_3c,&local_58,&local_5c);
          *(int32_t *)(lVar1 + uVar6 * 8) = local_58;
          *(int32_t *)(lVar1 + 4 + uVar6 * 8) = local_5c;
          uVar6 = uVar6 + 1;
        } while ((uint)num_points != uVar6);
      }
    }
    else {
      lVar1 = lVar1 + lVar2;
      uVar7 = 0;
      uVar6 = 0;
      do {
        uVar4 = pIVar5[uVar6].value_;
        if (attribute->identity_mapping_ == false) {
          uVar4 = (attribute->indices_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
        }
        sVar3 = (attribute->super_GeometryAttribute).byte_stride_;
        memcpy(local_3c,(void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                 (attribute->super_GeometryAttribute).byte_offset_ + uVar4 * sVar3),
               sVar3);
        OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                  (&local_50,local_3c,&local_58,&local_5c);
        *(int32_t *)(lVar1 + uVar7 * 8) = local_58;
        *(int32_t *)(lVar1 + 4 + uVar7 * 8) = local_5c;
        uVar7 = uVar7 + 1;
        uVar6 = uVar7 & 0xffffffff;
        pIVar5 = (point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(point_ids->
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >> 2
                              ));
    }
  }
  return local_54 < 0x1d;
}

Assistant:

bool AttributeOctahedronTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    int num_points, PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  // Quantize all values in the order given by point_ids into portable
  // attribute.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  float att_val[3];
  int32_t dst_index = 0;
  OctahedronToolBox converter;
  if (!converter.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  if (!point_ids.empty()) {
    for (uint32_t i = 0; i < point_ids.size(); ++i) {
      const AttributeValueIndex att_val_id =
          attribute.mapped_index(point_ids[i]);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  } else {
    for (PointIndex i(0); i < num_points; ++i) {
      const AttributeValueIndex att_val_id = attribute.mapped_index(i);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  }

  return true;
}